

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

SourceLocation inja::get_source_location(string_view content,size_t pos)

{
  size_type sVar1;
  size_type sVar2;
  size_type __pos;
  size_t sVar3;
  size_t sVar4;
  size_t in_R8;
  SourceLocation SVar5;
  string_view view;
  string_view sliced;
  
  view._M_len = content._M_str;
  view._M_str = (char *)0x0;
  sliced = string_view::slice((string_view *)content._M_len,view,pos,in_R8);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&sliced,'\n',0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    sVar3 = sliced._M_len + 1;
    sVar4 = 1;
  }
  else {
    sVar4 = 1;
    __pos = 0;
    while (__pos <= sliced._M_len) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&sliced,'\n',__pos);
      __pos = sVar2 + 1;
      if (__pos == 0) {
        break;
      }
      sVar4 = sVar4 + 1;
    }
    sVar3 = sliced._M_len - sVar1;
  }
  SVar5.column = sVar3;
  SVar5.line = sVar4;
  return SVar5;
}

Assistant:

inline SourceLocation get_source_location(std::string_view content, size_t pos) {
  // Get line and offset position (starts at 1:1)
  auto sliced = string_view::slice(content, 0, pos);
  const std::size_t last_newline = sliced.rfind('\n');

  if (last_newline == std::string_view::npos) {
    return {1, sliced.length() + 1};
  }

  // Count newlines
  size_t count_lines = 0;
  size_t search_start = 0;
  while (search_start <= sliced.size()) {
    search_start = sliced.find('\n', search_start) + 1;
    if (search_start == 0) {
      break;
    }
    count_lines += 1;
  }

  return {count_lines + 1, sliced.length() - last_newline};
}